

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O3

real fasttext::distL2(real *x,real *y,int32_t d)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  
  if (0 < d) {
    auVar2 = ZEXT816(0);
    uVar1 = 0;
    do {
      auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)(x[uVar1] - y[uVar1])),
                               ZEXT416((uint)(x[uVar1] - y[uVar1])));
      uVar1 = uVar1 + 1;
    } while ((uint)d != uVar1);
    return auVar2._0_4_;
  }
  return 0.0;
}

Assistant:

real distL2(const real* x, const real* y, int32_t d) {
  real dist = 0;
  for (auto i = 0; i < d; i++) {
    auto tmp = x[i] - y[i];
    dist += tmp * tmp;
  }
  return dist;
}